

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ReservedDescriptorTest_ReservedRanges_Test::
~ReservedDescriptorTest_ReservedRanges_Test(ReservedDescriptorTest_ReservedRanges_Test *this)

{
  (this->super_ReservedDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ReservedDescriptorTest_01883960;
  DescriptorPool::~DescriptorPool(&(this->super_ReservedDescriptorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST_F(ReservedDescriptorTest, ReservedRanges) {
  ASSERT_EQ(3, foo_->reserved_range_count());

  EXPECT_EQ(2, foo_->reserved_range(0)->start);
  EXPECT_EQ(3, foo_->reserved_range(0)->end);

  EXPECT_EQ(9, foo_->reserved_range(1)->start);
  EXPECT_EQ(12, foo_->reserved_range(1)->end);

  EXPECT_EQ(15, foo_->reserved_range(2)->start);
  EXPECT_EQ(16, foo_->reserved_range(2)->end);
}